

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main_impl.h
# Opt level: O3

int secp256k1_xonly_pubkey_serialize
              (secp256k1_context *ctx,uchar *output32,secp256k1_xonly_pubkey *pubkey)

{
  int iVar1;
  secp256k1_ge pk;
  secp256k1_ge local_70;
  
  if (ctx == (secp256k1_context *)0x0) {
    secp256k1_xonly_pubkey_serialize_cold_3();
  }
  else if (output32 != (uchar *)0x0) {
    output32[0x10] = '\0';
    output32[0x11] = '\0';
    output32[0x12] = '\0';
    output32[0x13] = '\0';
    output32[0x14] = '\0';
    output32[0x15] = '\0';
    output32[0x16] = '\0';
    output32[0x17] = '\0';
    output32[0x18] = '\0';
    output32[0x19] = '\0';
    output32[0x1a] = '\0';
    output32[0x1b] = '\0';
    output32[0x1c] = '\0';
    output32[0x1d] = '\0';
    output32[0x1e] = '\0';
    output32[0x1f] = '\0';
    output32[0] = '\0';
    output32[1] = '\0';
    output32[2] = '\0';
    output32[3] = '\0';
    output32[4] = '\0';
    output32[5] = '\0';
    output32[6] = '\0';
    output32[7] = '\0';
    output32[8] = '\0';
    output32[9] = '\0';
    output32[10] = '\0';
    output32[0xb] = '\0';
    output32[0xc] = '\0';
    output32[0xd] = '\0';
    output32[0xe] = '\0';
    output32[0xf] = '\0';
    if (pubkey == (secp256k1_xonly_pubkey *)0x0) {
      secp256k1_xonly_pubkey_serialize_cold_1();
      return 0;
    }
    iVar1 = secp256k1_pubkey_load(ctx,&local_70,(secp256k1_pubkey *)pubkey);
    if (iVar1 == 0) {
      return 0;
    }
    secp256k1_fe_get_b32(output32,&local_70.x);
    return 1;
  }
  secp256k1_xonly_pubkey_serialize_cold_2();
  return 0;
}

Assistant:

int secp256k1_xonly_pubkey_serialize(const secp256k1_context* ctx, unsigned char *output32, const secp256k1_xonly_pubkey *pubkey) {
    secp256k1_ge pk;

    VERIFY_CHECK(ctx != NULL);
    ARG_CHECK(output32 != NULL);
    memset(output32, 0, 32);
    ARG_CHECK(pubkey != NULL);

    if (!secp256k1_xonly_pubkey_load(ctx, &pk, pubkey)) {
        return 0;
    }
    secp256k1_fe_get_b32(output32, &pk.x);
    return 1;
}